

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

bool __thiscall
VmaDefragmentationContext_T::MoveDataToFreeBlocks
          (VmaDefragmentationContext_T *this,VmaSuballocationType currentType,VmaBlockVector *vector
          ,size_t firstFreeBlock,bool *texturePresent,bool *bufferPresent,bool *otherPresent)

{
  size_t sVar1;
  VmaBlockMetadata *metadata;
  int iVar2;
  CounterStatus CVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool *pbVar4;
  VmaSuballocationType suballocType1;
  size_t sVar5;
  bool bVar6;
  MoveAllocationData moveData;
  VmaAllocHandle handle;
  
  sVar1 = (this->m_Moves).m_Count;
  sVar5 = firstFreeBlock;
  do {
    bVar6 = sVar5 == 0;
    sVar5 = sVar5 - 1;
    if (bVar6) {
      return sVar1 == (this->m_Moves).m_Count;
    }
    metadata = (vector->m_Blocks).m_pArray[sVar5]->m_pMetadata;
    iVar2 = (*metadata->_vptr_VmaBlockMetadata[0xb])(metadata);
    handle = (VmaAllocHandle)CONCAT44(extraout_var,iVar2);
    while (handle != (VmaAllocHandle)0x0) {
      GetMoveData(&moveData,handle,metadata);
      if (((VmaDefragmentationContext_T *)(moveData.move.srcAllocation)->m_pUserData != this) &&
         (CVar3 = CheckCounters(this,(moveData.move.srcAllocation)->m_Size),
         suballocType1 = moveData.type, CVar3 != Ignore)) {
        if (CVar3 == End) {
          return true;
        }
        bVar6 = VmaIsBufferImageGranularityConflict(moveData.type,currentType);
        if ((!bVar6) &&
           (bVar6 = AllocInOtherBlock(this,firstFreeBlock,(vector->m_Blocks).m_Count,&moveData,
                                      vector), suballocType1 = moveData.type, bVar6)) {
          return false;
        }
        bVar6 = VmaIsBufferImageGranularityConflict
                          (suballocType1,VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL);
        pbVar4 = texturePresent;
        if ((bVar6) &&
           (bVar6 = VmaIsBufferImageGranularityConflict(suballocType1,VMA_SUBALLOCATION_TYPE_BUFFER)
           , pbVar4 = bufferPresent, bVar6)) {
          pbVar4 = otherPresent;
        }
        *pbVar4 = true;
      }
      iVar2 = (*metadata->_vptr_VmaBlockMetadata[0xc])(metadata,handle);
      handle = (VmaAllocHandle)CONCAT44(extraout_var_00,iVar2);
    }
  } while( true );
}

Assistant:

bool VmaDefragmentationContext_T::MoveDataToFreeBlocks(VmaSuballocationType currentType, 
    VmaBlockVector& vector, size_t firstFreeBlock,
    bool& texturePresent, bool& bufferPresent, bool& otherPresent)
{
    const size_t prevMoveCount = m_Moves.size();
    for (size_t i = firstFreeBlock ; i;)
    {
        VmaDeviceMemoryBlock* block = vector.GetBlock(--i);
        VmaBlockMetadata* metadata = block->m_pMetadata;

        for (VmaAllocHandle handle = metadata->GetAllocationListBegin();
            handle != VK_NULL_HANDLE;
            handle = metadata->GetNextAllocation(handle))
        {
            MoveAllocationData moveData = GetMoveData(handle, metadata);
            // Ignore newly created allocations by defragmentation algorithm
            if (moveData.move.srcAllocation->GetUserData() == this)
                continue;
            switch (CheckCounters(moveData.move.srcAllocation->GetSize()))
            {
            case CounterStatus::Ignore:
                continue;
            case CounterStatus::End:
                return true;
            default:
                VMA_ASSERT(0);
            case CounterStatus::Pass:
                break;
            }

            // Move only single type of resources at once
            if (!VmaIsBufferImageGranularityConflict(moveData.type, currentType))
            {
                // Try to fit allocation into free blocks
                if (AllocInOtherBlock(firstFreeBlock, vector.GetBlockCount(), moveData, vector))
                    return false;
            }

            if (!VmaIsBufferImageGranularityConflict(moveData.type, VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL))
                texturePresent = true;
            else if (!VmaIsBufferImageGranularityConflict(moveData.type, VMA_SUBALLOCATION_TYPE_BUFFER))
                bufferPresent = true;
            else
                otherPresent = true;
        }
    }
    return prevMoveCount == m_Moves.size();
}